

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_vector.hxx
# Opt level: O0

void __thiscall
vigra::ArrayVector<unsigned_char,_std::allocator<unsigned_char>_>::ArrayVector
          (ArrayVector<unsigned_char,_std::allocator<unsigned_char>_> *this,this_type *rhs)

{
  const_iterator pvVar1;
  const_iterator pvVar2;
  ArrayVector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  allocator<unsigned_char> *in_stack_ffffffffffffffb8;
  
  ArrayVectorView<unsigned_char>::ArrayVectorView(&in_RDI->super_ArrayVectorView<unsigned_char>);
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)in_RDI,in_stack_ffffffffffffffb8);
  pvVar1 = ArrayVectorView<unsigned_char>::begin((ArrayVectorView<unsigned_char> *)0x173cd3);
  pvVar2 = ArrayVectorView<unsigned_char>::end(&in_RDI->super_ArrayVectorView<unsigned_char>);
  ArrayVector<unsigned_char,std::allocator<unsigned_char>>::initImpl<unsigned_char_const*>
            (in_RDI,pvVar1,pvVar2);
  return;
}

Assistant:

ArrayVector( this_type const & rhs )
    : view_type(),
      alloc_(rhs.alloc_)
    {
        initImpl(rhs.begin(), rhs.end(), VigraFalseType());
    }